

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRExpression * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::allocate<spirv_cross::SPIRExpression&>
          (ObjectPool<spirv_cross::SPIRExpression> *this,SPIRExpression *p)

{
  size_t sVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ID IVar6;
  _Tuple_impl<0UL,_spirv_cross::SPIRExpression_*,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>
  _Var7;
  ulong uVar8;
  uint uVar9;
  _Head_base<0UL,_spirv_cross::SPIRExpression_*,_false> _Var10;
  SPIRExpression *pSVar11;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size == 0) {
    uVar9 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    uVar8 = (ulong)uVar9;
    _Var7.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>)malloc(uVar8 * 0xb8);
    if (_Var7.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl !=
        (SPIRExpression *)0x0) {
      _Var10._M_head_impl =
           (SPIRExpression *)
           _Var7.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl;
      if (uVar9 != 0) {
        do {
          SmallVector<spirv_cross::SPIRExpression_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size + 1
                    );
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.ptr[sVar1] =
               _Var10._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size = sVar1 + 1;
          uVar8 = uVar8 - 1;
          _Var10._M_head_impl = _Var10._M_head_impl + 1;
        } while (uVar8 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRExpression_*,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false> =
           _Var7.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var7.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl !=
          (SPIRExpression *)0x0) goto LAB_0024a176;
    }
    pSVar11 = (SPIRExpression *)0x0;
  }
  else {
LAB_0024a176:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size;
    pSVar11 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRExpression_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    (pSVar11->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_003fd260;
    (pSVar11->super_IVariant).self.id = (p->super_IVariant).self.id;
    (pSVar11->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRExpression_003fd2c8;
    *(undefined4 *)&(pSVar11->super_IVariant).field_0xc =
         *(undefined4 *)&(p->super_IVariant).field_0xc;
    (pSVar11->expression)._M_dataplus._M_p = (pointer)&(pSVar11->expression).field_2;
    pcVar2 = (p->expression)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar11->expression,pcVar2,pcVar2 + (p->expression)._M_string_length);
    bVar3 = p->need_transpose;
    bVar4 = p->access_chain;
    bVar5 = p->access_meshlet_position_y;
    pSVar11->immutable = p->immutable;
    pSVar11->need_transpose = bVar3;
    pSVar11->access_chain = bVar4;
    pSVar11->access_meshlet_position_y = bVar5;
    IVar6.id = (p->loaded_from).id;
    pSVar11->expression_type = (TypeID)(p->expression_type).id;
    pSVar11->loaded_from = (ID)IVar6.id;
    (pSVar11->expression_dependencies).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)0x0;
    (pSVar11->expression_dependencies).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0;
    (pSVar11->expression_dependencies).buffer_capacity = 0;
    (pSVar11->expression_dependencies).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)&(pSVar11->expression_dependencies).stack_storage;
    (pSVar11->expression_dependencies).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&pSVar11->expression_dependencies,&p->expression_dependencies);
    (pSVar11->implied_read_expressions).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)0x0;
    (pSVar11->implied_read_expressions).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0;
    (pSVar11->implied_read_expressions).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)&(pSVar11->implied_read_expressions).stack_storage;
    (pSVar11->implied_read_expressions).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&pSVar11->implied_read_expressions,&p->implied_read_expressions);
    pSVar11->emitted_loop_level = p->emitted_loop_level;
  }
  return pSVar11;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}